

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O3

bool __thiscall libcellml::Model::linkUnits(Model *this)

{
  bool bVar1;
  element_type *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  ComponentEntityPtr local_18;
  
  std::__shared_ptr<libcellml::Model,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Model,void>
            ((__shared_ptr<libcellml::Model,(__gnu_cxx::_Lock_policy)2> *)&local_28,
             (__weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<libcellml::Model>);
  local_18.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_28;
  local_18.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Stack_20;
  local_28 = (element_type *)0x0;
  p_Stack_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  bVar1 = traverseComponentEntityTreeLinkingUnits(&local_18);
  if (local_18.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_18.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_20);
  }
  return bVar1;
}

Assistant:

bool Model::linkUnits()
{
    return traverseComponentEntityTreeLinkingUnits(shared_from_this());
}